

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

vector<example::option_t,_std::allocator<example::option_t>_> * __thiscall
example::lazy<std::vector<example::option_t,_std::allocator<example::option_t>_>_>::get
          (lazy<std::vector<example::option_t,_std::allocator<example::option_t>_>_> *this)

{
  reference_type pvVar1;
  vector<example::option_t,_std::allocator<example::option_t>_> tmp;
  reader r;
  vector<example::option_t,_std::allocator<example::option_t>_> local_48;
  reader local_28;
  
  if ((this->val_).super_type.m_initialized == false) {
    local_28.buf_.data_ = (this->buf_).data_;
    local_28.buf_.size_ = (this->buf_).size_;
    local_28.opts_.super_type.m_initialized = false;
    local_48.super__Vector_base<example::option_t,_std::allocator<example::option_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<example::option_t,_std::allocator<example::option_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<example::option_t,_std::allocator<example::option_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    detail::reader::operator()(&local_28,&local_48);
    boost::optional_detail::
    optional_base<std::vector<example::option_t,_std::allocator<example::option_t>_>_>::assign
              (&(this->val_).super_type,&local_48);
    std::vector<example::option_t,_std::allocator<example::option_t>_>::~vector(&local_48);
  }
  pvVar1 = boost::optional<std::vector<example::option_t,_std::allocator<example::option_t>_>_>::get
                     (&this->val_);
  return pvVar1;
}

Assistant:

T& lazy<T>::get() {
        if (!val_) {
            detail::reader r(buf_);
            T tmp;
            r(tmp);
            val_ = tmp;
        }
        return *val_;
    }